

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_decoder.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,DecoderBuffer *buffer)

{
  bool bVar1;
  uint16_t uVar2;
  DecoderBuffer *in_RSI;
  PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_> *in_RDI;
  uint8_t prediction_mode;
  undefined7 in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe7;
  PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
  *source_buffer;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  source_buffer = in_RDI;
  PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::transform
            (in_RDI);
  bVar1 = PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
                    ((PredictionSchemeWrapDecodingTransform<int,_int> *)in_RSI,
                     (DecoderBuffer *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0))
  ;
  if (!bVar1) {
    return false;
  }
  uVar2 = DecoderBuffer::bitstream_version(in_RSI);
  if (uVar2 < 0x202) {
    bVar1 = DecoderBuffer::Decode<unsigned_char>
                      (in_RSI,(uchar *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0)
                      );
    if (!bVar1) {
      return false;
    }
    bVar1 = MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
            ::SetNormalPredictionMode
                      ((MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                        *)&in_RDI[1].transform_.super_PredictionSchemeWrapTransformBase<int>.
                           max_correction_,(uint)in_stack_ffffffffffffffe7);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = RAnsBitDecoder::StartDecoding
                    ((RAnsBitDecoder *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                     ,(DecoderBuffer *)source_buffer);
  return bVar1;
}

Assistant:

bool MeshPredictionSchemeGeometricNormalDecoder<
    DataTypeT, TransformT, MeshDataT>::DecodePredictionData(DecoderBuffer
                                                                *buffer) {
  // Get data needed for transform
  if (!this->transform().DecodeTransformData(buffer)) {
    return false;
  }

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint8_t prediction_mode;
    if (!buffer->Decode(&prediction_mode)) {
      return false;
    }

    if (!predictor_.SetNormalPredictionMode(
            NormalPredictionMode(prediction_mode))) {
      return false;
    }
  }
#endif

  // Init normal flips.
  if (!flip_normal_bit_decoder_.StartDecoding(buffer)) {
    return false;
  }

  return true;
}